

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

void __thiscall Infector::AnyShared<BadClassVS>::setPtr(AnyShared<BadClassVS> *this)

{
  void *in_RSI;
  
  setPtr((AnyShared<BadClassVS> *)(&this->field_0x0 + *(long *)(*(long *)this + -0x20)),in_RSI);
  return;
}

Assistant:

virtual void setPtr(void * p) override {
            T* tp = reinterpret_cast<T*>(p);
            try{
                ist.reset(tp);
                resolve_multiple_cast<T,Bases...>(tp);
            }catch(std::exception & ex){
                multi_solver.clear();
                throw ex;
            }catch(...){
                multi_solver.clear();
                throw ExUnkownException();
            }
        }